

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O3

void __thiscall
cmCTestCoverageHandler::EndCoverageLogFile
          (cmCTestCoverageHandler *this,cmGeneratedFileStream *ostr,int logFileCount)

{
  cmCTest *this_00;
  size_t sVar1;
  ostringstream cmCTestLog_msg;
  char covLogFilename [1024];
  long *local_5c0;
  long local_5b0 [2];
  undefined1 local_5a0 [376];
  char local_428 [1032];
  
  snprintf(local_428,0x400,"CoverageLog-%d.xml",logFileCount);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5a0,"Close file: ",0xc);
  sVar1 = strlen(local_428);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5a0,local_428,sVar1);
  std::ios::widen((char)(ostream *)local_5a0 + (char)*(_func_int **)(local_5a0._0_8_ + -0x18));
  std::ostream::put((char)local_5a0);
  std::ostream::flush();
  this_00 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(this_00,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
               ,0xac,(char *)local_5c0,(this->super_cmCTestGenericHandler).Quiet);
  if (local_5c0 != local_5b0) {
    operator_delete(local_5c0,local_5b0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5a0);
  std::ios_base::~ios_base((ios_base *)(local_5a0 + 0x70));
  cmGeneratedFileStream::Close(ostr);
  return;
}

Assistant:

void cmCTestCoverageHandler::EndCoverageLogFile(cmGeneratedFileStream& ostr,
                                                int logFileCount)
{
  char covLogFilename[1024];
  snprintf(covLogFilename, sizeof(covLogFilename), "CoverageLog-%d.xml",
           logFileCount);
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Close file: " << covLogFilename << std::endl,
                     this->Quiet);
  ostr.Close();
}